

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

string * __thiscall
vkt::BindingModel::(anonymous_namespace)::BufferDescriptorCase::genResourceDeclarations_abi_cxx11_
          (string *__return_storage_ptr__,void *this,VkShaderStageFlagBits stage,int numUsedBindings
          )

{
  int iVar1;
  bool bVar2;
  char *pcVar3;
  ostream *poVar4;
  ostringstream local_1a8 [8];
  ostringstream buf;
  char *storageType;
  bool isUniform;
  int numUsedBindings_local;
  VkShaderStageFlagBits stage_local;
  BufferDescriptorCase *this_local;
  
  bVar2 = BindingModel::anon_unknown_1::isUniformDescriptorType
                    (*(VkDescriptorType *)((long)this + 0x84));
  pcVar3 = "buffer";
  if (bVar2) {
    pcVar3 = "uniform";
  }
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  iVar1 = *(int *)((long)this + 0x88);
  if (iVar1 == 0) {
    poVar4 = std::operator<<((ostream *)local_1a8,"layout(set = 0, binding = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,numUsedBindings);
    poVar4 = std::operator<<(poVar4,", std140) ");
    poVar4 = std::operator<<(poVar4,pcVar3);
    poVar4 = std::operator<<(poVar4," BufferName\n");
    poVar4 = std::operator<<(poVar4,"{\n");
    poVar4 = std::operator<<(poVar4,"\thighp vec4 colorA;\n");
    poVar4 = std::operator<<(poVar4,"\thighp vec4 colorB;\n");
    std::operator<<(poVar4,"} b_instance;\n");
  }
  else if (iVar1 == 1) {
    poVar4 = std::operator<<((ostream *)local_1a8,"layout(set = 0, binding = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,numUsedBindings);
    poVar4 = std::operator<<(poVar4,", std140) ");
    poVar4 = std::operator<<(poVar4,pcVar3);
    poVar4 = std::operator<<(poVar4," BufferNameA\n");
    poVar4 = std::operator<<(poVar4,"{\n");
    poVar4 = std::operator<<(poVar4,"\thighp vec4 colorA;\n");
    poVar4 = std::operator<<(poVar4,"\thighp vec4 colorB;\n");
    poVar4 = std::operator<<(poVar4,"} b_instanceA;\n");
    poVar4 = std::operator<<(poVar4,"layout(set = 0, binding = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,numUsedBindings + 1);
    poVar4 = std::operator<<(poVar4,", std140) ");
    poVar4 = std::operator<<(poVar4,pcVar3);
    poVar4 = std::operator<<(poVar4," BufferNameB\n");
    poVar4 = std::operator<<(poVar4,"{\n");
    poVar4 = std::operator<<(poVar4,"\thighp vec4 colorA;\n");
    poVar4 = std::operator<<(poVar4,"\thighp vec4 colorB;\n");
    std::operator<<(poVar4,"} b_instanceB;\n");
  }
  else if (iVar1 == 3) {
    poVar4 = std::operator<<((ostream *)local_1a8,"layout(set = 0, binding = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,numUsedBindings);
    poVar4 = std::operator<<(poVar4,", std140) ");
    poVar4 = std::operator<<(poVar4,pcVar3);
    poVar4 = std::operator<<(poVar4," BufferName\n");
    poVar4 = std::operator<<(poVar4,"{\n");
    poVar4 = std::operator<<(poVar4,"\thighp vec4 colorA;\n");
    poVar4 = std::operator<<(poVar4,"\thighp vec4 colorB;\n");
    std::operator<<(poVar4,"} b_instances[2];\n");
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string BufferDescriptorCase::genResourceDeclarations (vk::VkShaderStageFlagBits stage, int numUsedBindings) const
{
	DE_UNREF(stage);

	const bool			isUniform		= isUniformDescriptorType(m_descriptorType);
	const char* const	storageType		= (isUniform) ? ("uniform") : ("buffer");
	std::ostringstream	buf;

	switch (m_shaderInterface)
	{
		case SHADER_INPUT_SINGLE_DESCRIPTOR:
			buf	<< "layout(set = 0, binding = " << (numUsedBindings) << ", std140) " << storageType << " BufferName\n"
				<< "{\n"
				<< "	highp vec4 colorA;\n"
				<< "	highp vec4 colorB;\n"
				<< "} b_instance;\n";
			break;

		case SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS:
			buf	<< "layout(set = 0, binding = " << (numUsedBindings) << ", std140) " << storageType << " BufferNameA\n"
				<< "{\n"
				<< "	highp vec4 colorA;\n"
				<< "	highp vec4 colorB;\n"
				<< "} b_instanceA;\n"
				<< "layout(set = 0, binding = " << (numUsedBindings+1) << ", std140) " << storageType << " BufferNameB\n"
				<< "{\n"
				<< "	highp vec4 colorA;\n"
				<< "	highp vec4 colorB;\n"
				<< "} b_instanceB;\n";
			break;

		case SHADER_INPUT_DESCRIPTOR_ARRAY:
			buf	<< "layout(set = 0, binding = " << (numUsedBindings) << ", std140) " << storageType << " BufferName\n"
				<< "{\n"
				<< "	highp vec4 colorA;\n"
				<< "	highp vec4 colorB;\n"
				<< "} b_instances[2];\n";
			break;

		default:
			DE_FATAL("Impossible");
	}

	return buf.str();
}